

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# conc_heter_queue.h
# Opt level: O3

reentrant_put_transaction<unsigned_int> * __thiscall
density::conc_heter_queue<density::runtime_type<>,density::basic_default_allocator<65536ul>>::
start_reentrant_emplace<unsigned_int,unsigned_int&>
          (reentrant_put_transaction<unsigned_int> *__return_storage_ptr__,
          conc_heter_queue<density::runtime_type<>,density::basic_default_allocator<65536ul>> *this,
          uint *i_construction_params)

{
  undefined1 auVar1 [16];
  int iVar2;
  undefined1 local_88 [24];
  void *pvStack_70;
  reentrant_put_transaction<unsigned_int> local_60;
  reentrant_put_transaction<unsigned_int> local_48;
  
  iVar2 = pthread_mutex_lock((pthread_mutex_t *)this);
  if (iVar2 == 0) {
    local_88._8_16_ =
         (undefined1  [16])
         heter_queue<density::runtime_type<>,density::basic_default_allocator<65536ul>>::
         inplace_allocate<1ul,true,4ul,4ul>
                   ((heter_queue<density::runtime_type<>,density::basic_default_allocator<65536ul>>
                     *)(this + 0x28));
    local_88._8_8_[1].m_next =
         (uintptr_t)
         detail::
         FeatureTable<std::tuple<density::f_size,density::f_alignment,density::f_copy_construct,density::f_move_construct,density::f_rtti,density::f_destroy>,unsigned_int>
         ::s_table;
    *local_88._16_8_ = *i_construction_params;
    local_88._0_8_ =
         (conc_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<65536UL>_>
          *)0x0;
    local_60.m_put_data = (Allocation)local_88._8_16_;
    heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
    reentrant_put_transaction<unsigned_int>::~reentrant_put_transaction
              ((reentrant_put_transaction<unsigned_int> *)local_88);
    local_60.m_queue =
         (heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<65536UL>_>
          *)0x0;
    local_48.m_put_data = local_60.m_put_data;
    heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
    reentrant_put_transaction<unsigned_int>::~reentrant_put_transaction(&local_60);
    pvStack_70 = local_48.m_put_data.m_user_storage;
    local_48.m_queue =
         (heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<65536UL>_>
          *)0x0;
    __return_storage_ptr__->m_queue =
         (conc_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<65536UL>_>
          *)this;
    (__return_storage_ptr__->m_put_transaction).m_queue =
         (heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<65536UL>_>
          *)(this + 0x28);
    (__return_storage_ptr__->m_put_transaction).m_put_data = local_48.m_put_data;
    local_88._0_8_ =
         (conc_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<65536UL>_>
          *)0x0;
    auVar1._8_8_ = 0;
    auVar1._0_8_ = local_48.m_put_data.m_control_block;
    local_88._8_16_ = auVar1 << 0x40;
    conc_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
    reentrant_put_transaction<unsigned_int>::~reentrant_put_transaction
              ((reentrant_put_transaction<unsigned_int> *)local_88);
    heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
    reentrant_put_transaction<unsigned_int>::~reentrant_put_transaction(&local_48);
    pthread_mutex_unlock((pthread_mutex_t *)this);
    return __return_storage_ptr__;
  }
  std::__throw_system_error(iVar2);
}

Assistant:

reentrant_put_transaction<ELEMENT_TYPE>
          start_reentrant_emplace(CONSTRUCTION_PARAMS &&... i_construction_params)
        {
            std::lock_guard<std::mutex> lock(m_mutex);
            auto put_transaction = m_queue.template start_reentrant_emplace<ELEMENT_TYPE>(
              std::forward<CONSTRUCTION_PARAMS>(i_construction_params)...);
            return reentrant_put_transaction<ELEMENT_TYPE>(
              PrivateType(), this, std::move(put_transaction));
        }